

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

string * __thiscall
cmFortranParser_s::SModName
          (string *__return_storage_ptr__,cmFortranParser_s *this,string *mod_name,string *sub_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *sub_name_local;
  string *mod_name_local;
  cmFortranParser_s *this_local;
  
  local_28 = sub_name;
  sub_name_local = mod_name;
  mod_name_local = (string *)this;
  this_local = (cmFortranParser_s *)__return_storage_ptr__;
  std::operator+(&local_68,mod_name,&(this->Compiler).SModSep);
  std::operator+(&local_48,&local_68,local_28);
  std::operator+(__return_storage_ptr__,&local_48,&(this->Compiler).SModExt);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFortranParser_s::SModName(std::string const& mod_name,
                                        std::string const& sub_name) const
{
  return mod_name + this->Compiler.SModSep + sub_name + this->Compiler.SModExt;
}